

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcRefactor.c
# Opt level: O2

Abc_ManRef_t * Abc_NtkManRefStart(int nNodeSizeMax,int nConeSizeMax,int fUseDcs,int fVerbose)

{
  byte bVar1;
  Abc_ManRef_t *pAVar2;
  Vec_Str_t *pVVar3;
  char *pcVar4;
  Vec_Ptr_t *pVVar5;
  void **ppvVar6;
  long lVar7;
  Vec_Int_t *pVVar8;
  int *piVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  int nCap;
  void *pvVar13;
  uint uVar14;
  ulong uVar15;
  
  pAVar2 = (Abc_ManRef_t *)calloc(1,0xa8);
  pVVar3 = (Vec_Str_t *)malloc(0x10);
  pVVar3->nCap = 100;
  pVVar3->nSize = 0;
  nCap = 100;
  pcVar4 = (char *)malloc(100);
  pVVar3->pArray = pcVar4;
  pAVar2->vCube = pVVar3;
  pVVar5 = Vec_PtrAlloc(nCap);
  pAVar2->vVisited = pVVar5;
  pAVar2->nNodeSizeMax = nNodeSizeMax;
  pAVar2->nConeSizeMax = nConeSizeMax;
  uVar15 = 6;
  if (6 < nNodeSizeMax) {
    uVar15 = (ulong)(uint)nNodeSizeMax;
  }
  pAVar2->fVerbose = fVerbose;
  bVar1 = (char)uVar15 - 5U & 0x1f;
  uVar14 = 1 << bVar1;
  ppvVar6 = (void **)malloc(((long)(int)uVar14 * 4 + 8) * uVar15);
  lVar7 = uVar15 * 8;
  for (uVar10 = 0; uVar15 != uVar10; uVar10 = uVar10 + 1) {
    ppvVar6[uVar10] = (void *)((long)ppvVar6 + lVar7);
    lVar7 = lVar7 + (long)(int)uVar14 * 4;
  }
  pvVar13 = (void *)0x10;
  pVVar5 = (Vec_Ptr_t *)malloc(0x10);
  pVVar5->nSize = (int)uVar15;
  pVVar5->nCap = (int)uVar15;
  pVVar5->pArray = ppvVar6;
  uVar12 = 0;
  uVar10 = (ulong)uVar14;
  if (1 << bVar1 < 1) {
    uVar10 = uVar12;
  }
  for (; uVar12 != uVar15; uVar12 = uVar12 + 1) {
    pvVar13 = ppvVar6[uVar12];
    if (uVar12 < 5) {
      for (uVar11 = 0; uVar10 != uVar11; uVar11 = uVar11 + 1) {
        *(undefined4 *)((long)pvVar13 + uVar11 * 4) = (&DAT_007aafa0)[uVar12];
      }
    }
    else {
      for (uVar11 = 0; uVar10 != uVar11; uVar11 = uVar11 + 1) {
        *(uint *)((long)pvVar13 + uVar11 * 4) =
             -(uint)((1 << ((char)uVar12 - 5U & 0x1f) & (uint)uVar11) != 0);
      }
    }
  }
  pAVar2->vVars = pVVar5;
  pVVar5 = Vec_PtrAlloc((int)pvVar13);
  pAVar2->vFuncs = pVVar5;
  pVVar8 = (Vec_Int_t *)malloc(0x10);
  pVVar8->nCap = 0x10000;
  pVVar8->nSize = 0;
  piVar9 = (int *)malloc(0x40000);
  pVVar8->pArray = piVar9;
  pAVar2->vMemory = pVVar8;
  return pAVar2;
}

Assistant:

Abc_ManRef_t * Abc_NtkManRefStart( int nNodeSizeMax, int nConeSizeMax, int fUseDcs, int fVerbose )
{
    Abc_ManRef_t * p;
    p = ABC_ALLOC( Abc_ManRef_t, 1 );
    memset( p, 0, sizeof(Abc_ManRef_t) );
    p->vCube        = Vec_StrAlloc( 100 );
    p->vVisited     = Vec_PtrAlloc( 100 );
    p->nNodeSizeMax = nNodeSizeMax;
    p->nConeSizeMax = nConeSizeMax;
    p->fVerbose     = fVerbose;
    p->vVars        = Vec_PtrAllocTruthTables( Abc_MaxInt(nNodeSizeMax, 6) );
    p->vFuncs       = Vec_PtrAlloc( 100 );
    p->vMemory      = Vec_IntAlloc( 1 << 16 );
    return p;
}